

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

uint __thiscall
JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
RemoveAtEnd(List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  int iVar6;
  
  iVar6 = (this->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count;
  if (iVar6 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x1d2,"(this->count >= 1)","this->count >= 1");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    iVar6 = (this->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count;
  }
  pTVar5 = Item(this,iVar6 + -1);
  uVar1 = *pTVar5;
  Js::
  CopyRemovePolicy<JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::RemoveAt((CopyRemovePolicy<JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              *)&this->field_0x28,this,
             (this->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count
             + -1);
  return uVar1;
}

Assistant:

T RemoveAtEnd()
        {
            Assert(this->count >= 1);
            T item = this->Item(this->count - 1);
            RemoveAt(this->count - 1);
            return item;
        }